

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item::show_widgets(Fl_Tree_Item *this)

{
  int iVar1;
  Fl_Tree_Item *this_00;
  int local_14;
  int t;
  Fl_Tree_Item *this_local;
  
  if (this->_widget != (Fl_Widget *)0x0) {
    (*this->_widget->_vptr_Fl_Widget[5])();
  }
  iVar1 = is_open(this);
  if (iVar1 != 0) {
    for (local_14 = 0; iVar1 = Fl_Tree_Item_Array::total(&this->_children), local_14 < iVar1;
        local_14 = local_14 + 1) {
      this_00 = Fl_Tree_Item_Array::operator[](&this->_children,local_14);
      show_widgets(this_00);
    }
  }
  return;
}

Assistant:

void Fl_Tree_Item::show_widgets() {
  if ( _widget ) _widget->show();
  if ( is_open() ) {
    for ( int t=0; t<_children.total(); t++ ) {
      _children[t]->show_widgets();
    }
  }
}